

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Logging.cpp
# Opt level: O1

double soul::Logger::log(double __x)

{
  int iVar1;
  Message *in_RDI;
  double extraout_XMM0_Qa;
  
  getCallbackHolder();
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&getCallbackHolder::l);
  if (iVar1 == 0) {
    if (getCallbackHolder::l.callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*getCallbackHolder::l.callback._M_invoker)
                ((_Any_data *)&getCallbackHolder::l.callback,in_RDI);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&getCallbackHolder::l);
    return extraout_XMM0_Qa;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Logger::log (const Message& message)
{
    auto& holder = getCallbackHolder();
    std::lock_guard<std::mutex> g (holder.lock);

    if (holder.callback != nullptr)
        holder.callback (message);
}